

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.hpp
# Opt level: O2

bool __thiscall tcu::Interval::operator==(Interval *this,Interval *other)

{
  double dVar1;
  double dVar2;
  
  if (this->m_hasNaN == other->m_hasNaN) {
    dVar1 = this->m_lo;
    dVar2 = other->m_lo;
    if ((this->m_hi < dVar1) && (other->m_hi <= dVar2 && dVar2 != other->m_hi)) {
      return true;
    }
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      return (bool)(-(this->m_hi == other->m_hi) & 1);
    }
  }
  return false;
}

Assistant:

bool		operator==		(const Interval& other) const
	{
		return ((m_hasNaN == other.m_hasNaN) &&
				((empty() && other.empty()) ||
				 (m_lo == other.m_lo && m_hi == other.m_hi)));
	}